

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O0

void __thiscall asio::detail::thread_info_base::capture_current_exception(thread_info_base *this)

{
  multiple_exceptions *in_RDI;
  exception_ptr *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar1;
  multiple_exceptions *in_stack_ffffffffffffffd0;
  multiple_exceptions *in_stack_ffffffffffffffd8;
  
  iVar1 = *(int *)(in_RDI + 6);
  if (iVar1 == 0) {
    *(undefined4 *)(in_RDI + 6) = 1;
    std::current_exception();
    CLI::std::__exception_ptr::exception_ptr::operator=
              ((exception_ptr *)in_stack_ffffffffffffffd0,
               (exception_ptr *)CONCAT44(iVar1,in_stack_ffffffffffffffc8));
    CLI::std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)in_RDI);
  }
  else if (iVar1 == 1) {
    *(undefined4 *)(in_RDI + 6) = 2;
    CLI::std::__exception_ptr::exception_ptr::exception_ptr
              ((exception_ptr *)in_RDI,in_stack_ffffffffffffffb8);
    multiple_exceptions::multiple_exceptions
              (in_stack_ffffffffffffffd0,(exception_ptr *)CONCAT44(iVar1,in_stack_ffffffffffffffc8))
    ;
    CLI::std::make_exception_ptr<asio::multiple_exceptions>(in_stack_ffffffffffffffd8);
    CLI::std::__exception_ptr::exception_ptr::operator=
              ((exception_ptr *)in_stack_ffffffffffffffd0,
               (exception_ptr *)CONCAT44(iVar1,in_stack_ffffffffffffffc8));
    CLI::std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)in_RDI);
    multiple_exceptions::~multiple_exceptions(in_RDI);
    CLI::std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)in_RDI);
  }
  return;
}

Assistant:

void capture_current_exception()
  {
#if !defined(ASIO_NO_EXCEPTIONS)
    switch (has_pending_exception_)
    {
    case 0:
      has_pending_exception_ = 1;
      pending_exception_ = std::current_exception();
      break;
    case 1:
      has_pending_exception_ = 2;
      pending_exception_ =
        std::make_exception_ptr<multiple_exceptions>(
            multiple_exceptions(pending_exception_));
      break;
    default:
      break;
    }
#endif // !defined(ASIO_NO_EXCEPTIONS)
  }